

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void ConvertRowsToUV(uint16_t *rgb,uint8_t *dst_u,uint8_t *dst_v,int width,VP8Random *rg)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  ushort *in_RDI;
  undefined8 in_R8;
  int b;
  int g;
  int r;
  int i;
  int iVar3;
  int in_stack_ffffffffffffffe0;
  ushort *local_8;
  
  local_8 = in_RDI;
  for (iVar3 = 0; iVar3 < in_ECX; iVar3 = iVar3 + 1) {
    uVar1 = (uint)*local_8;
    iVar2 = RGBToU(in_ECX,in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),
                   (VP8Random *)CONCAT44(iVar3,uVar1));
    *(char *)(in_RSI + iVar3) = (char)iVar2;
    iVar2 = RGBToV(in_ECX,in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),
                   (VP8Random *)CONCAT44(iVar3,uVar1));
    *(char *)(in_RDX + iVar3) = (char)iVar2;
    local_8 = local_8 + 4;
  }
  return;
}

Assistant:

static WEBP_INLINE void ConvertRowsToUV(const uint16_t* rgb,
                                        uint8_t* const dst_u,
                                        uint8_t* const dst_v,
                                        int width,
                                        VP8Random* const rg) {
  int i;
  for (i = 0; i < width; i += 1, rgb += 4) {
    const int r = rgb[0], g = rgb[1], b = rgb[2];
    dst_u[i] = RGBToU(r, g, b, rg);
    dst_v[i] = RGBToV(r, g, b, rg);
  }
}